

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_open(cs_arch arch,cs_mode mode,csh *handle)

{
  cs_struct *pcVar1;
  undefined8 *in_RDX;
  cs_mode in_ESI;
  cs_arch in_EDI;
  cs_struct *ud;
  cs_err err;
  cs_err local_4;
  
  if ((((cs_mem_malloc == (cs_malloc_t)0x0) || (cs_mem_calloc == (cs_calloc_t)0x0)) ||
      (cs_mem_realloc == (cs_realloc_t)0x0)) ||
     ((cs_mem_free == (cs_free_t)0x0 || (cs_vsnprintf == (cs_vsnprintf_t)0x0)))) {
    local_4 = CS_ERR_MEMSETUP;
  }
  else if ((in_EDI < CS_ARCH_MAX) && (cs_arch_init[in_EDI] != (_func_cs_err_cs_struct_ptr *)0x0)) {
    if ((in_ESI & cs_arch_disallowed_mode_mask[in_EDI]) == CS_MODE_ARM) {
      pcVar1 = (cs_struct *)(*cs_mem_calloc)(1,0xb8);
      if (pcVar1 == (cs_struct *)0x0) {
        local_4 = CS_ERR_MEM;
      }
      else {
        pcVar1->errnum = CS_ERR_OK;
        pcVar1->arch = in_EDI;
        pcVar1->mode = in_ESI;
        pcVar1->detail = CS_OPT_OFF;
        (pcVar1->skipdata_setup).mnemonic = ".byte";
        local_4 = (*cs_arch_init[pcVar1->arch])(pcVar1);
        if (local_4 == CS_ERR_OK) {
          *in_RDX = pcVar1;
          local_4 = CS_ERR_OK;
        }
        else {
          (*cs_mem_free)(pcVar1);
          *in_RDX = 0;
        }
      }
    }
    else {
      *in_RDX = 0;
      local_4 = CS_ERR_MODE;
    }
  }
  else {
    *in_RDX = 0;
    local_4 = CS_ERR_ARCH;
  }
  return local_4;
}

Assistant:

CAPSTONE_API cs_open(cs_arch arch, cs_mode mode, csh *handle)
{
	cs_err err;
	struct cs_struct *ud;
	if (!cs_mem_malloc || !cs_mem_calloc || !cs_mem_realloc || !cs_mem_free || !cs_vsnprintf)
		// Error: before cs_open(), dynamic memory management must be initialized
		// with cs_option(CS_OPT_MEM)
		return CS_ERR_MEMSETUP;

	if (arch < CS_ARCH_MAX && cs_arch_init[arch]) {
		// verify if requested mode is valid
		if (mode & cs_arch_disallowed_mode_mask[arch]) {
			*handle = 0;
			return CS_ERR_MODE;
		}

		ud = cs_mem_calloc(1, sizeof(*ud));
		if (!ud) {
			// memory insufficient
			return CS_ERR_MEM;
		}

		ud->errnum = CS_ERR_OK;
		ud->arch = arch;
		ud->mode = mode;
		// by default, do not break instruction into details
		ud->detail = CS_OPT_OFF;

		// default skipdata setup
		ud->skipdata_setup.mnemonic = SKIPDATA_MNEM;

		err = cs_arch_init[ud->arch](ud);
		if (err) {
			cs_mem_free(ud);
			*handle = 0;
			return err;
		}

		*handle = (uintptr_t)ud;

		return CS_ERR_OK;
	} else {
		*handle = 0;
		return CS_ERR_ARCH;
	}
}